

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t6(int pi)

{
  undefined4 uVar1;
  int iVar2;
  int in_EDI;
  int unaff_retaddr;
  int id;
  int p;
  int t;
  int tp;
  undefined4 in_stack_ffffffffffffffe8;
  int pc;
  int expect;
  
  printf("Trigger tests.\n");
  gpio_write(in_EDI,0x19,0);
  expect = 0;
  uVar1 = callback(in_EDI,0x19,2,t6cbf);
  time_sleep(0x3fc999999999999a);
  for (pc = 0; pc < 5; pc = pc + 1) {
    time_sleep(0x3fb999999999999a);
    iVar2 = pc * 10 + 10;
    expect = iVar2 + expect;
    gpio_trigger(in_EDI,0x19,iVar2,1);
  }
  time_sleep(0x3fe0000000000000);
  CHECK(id,unaff_retaddr,in_EDI,expect,pc,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  CHECK(id,unaff_retaddr,in_EDI,expect,pc,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  callback_cancel(uVar1);
  return;
}

Assistant:

void t6(int pi)
{
   int tp, t, p, id;

   printf("Trigger tests.\n");

   gpio_write(pi, GPIO, PI_LOW);

   tp = 0;

   id = callback(pi, GPIO, EITHER_EDGE, t6cbf);

   time_sleep(0.2);

   for (t=0; t<5; t++)
   {
      time_sleep(0.1);
      p = 10 + (t*10);
      tp += p;
      gpio_trigger(pi, GPIO, p, 1);
   }

   time_sleep(0.5);

   CHECK(6, 1, t6_count, 5, 0, "gpio trigger count");

   CHECK(6, 2, t6_on, tp, 25, "gpio trigger pulse length");

   callback_cancel(id);
}